

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O3

value_type * __thiscall
(anonymous_namespace)::
serialize_and_visit<(anonymous_namespace)::ToString,test::UnsignedLargeEnumClass>
          (value_type *__return_storage_ptr__,_anonymous_namespace_ *this,UnsignedLargeEnumClass *in
          )

{
  uint *puVar1;
  long lVar2;
  value_type *pvVar3;
  string_view full_tag;
  string_view tag_00;
  InputStream istream;
  cx_string<86UL> tag;
  ToString visitor;
  stringstream stream;
  InputStream local_390;
  char local_387 [87];
  undefined8 local_330 [2];
  long local_320;
  uint auStack_308 [22];
  ios_base aiStack_2b0 [264];
  long local_1a8 [2];
  char local_198 [12];
  undefined4 auStack_18c [25];
  ios_base aiStack_128 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  lVar2 = *(long *)(local_1a8[0] + -0x18);
  *(undefined4 *)((long)auStack_18c + lVar2) = 4;
  std::ios::clear((int)local_387 + (int)lVar2 + 0x1df);
  local_330[0] = *(undefined8 *)this;
  std::ostream::write(local_198,(long)local_330);
  std::__cxx11::stringstream::stringstream((stringstream *)local_330);
  puVar1 = (uint *)((long)auStack_308 + *(long *)(local_320 + -0x18));
  *puVar1 = *puVar1 | 1;
  local_390.stream = (stringstream *)local_1a8;
  mserialize::CustomTag<test::UnsignedLargeEnumClass,_void>::tag_string();
  full_tag._len = 0x56;
  full_tag._ptr = local_387;
  tag_00._len = 0x56;
  tag_00._ptr = local_387;
  mserialize::detail::visit_impl<(anonymous_namespace)::ToString,InputStream>
            (full_tag,tag_00,(ToString *)local_330,&local_390,0x800);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_330);
  std::ios_base::~ios_base(aiStack_2b0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  pvVar3 = (value_type *)std::ios_base::~ios_base(aiStack_128);
  return pvVar3;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}